

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

iterator __thiscall
fmt::v10::formatter<ot::commissioner::coap::OptionType,_char,_void>::format
          (formatter<ot::commissioner::coap::OptionType,_char,_void> *this,OptionType optionType,
          format_context *ctx)

{
  int iVar1;
  arg_ref<char> ref;
  appender aVar2;
  formatter<ot::commissioner::coap::OptionType,_char,_void> *value;
  undefined6 in_register_00000032;
  buffer<char> *this_00;
  format_specs<char> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar3;
  char *pcVar4;
  string_view fmt;
  basic_string_view<char> s;
  format_args args;
  dynamic_format_specs<char> specs;
  undefined1 local_78 [16];
  undefined1 local_68 [24];
  parse_func ap_Stack_50 [1];
  value local_48;
  format_specs<char> local_38;
  
  iVar1 = (int)CONCAT62(in_register_00000032,optionType);
  pcVar4 = (char *)0x8;
  switch(iVar1) {
  case 1:
    pcVar3 = "kIfMatch";
    break;
  case 3:
    pcVar3 = "kUriHost";
    break;
  case 4:
    pcVar3 = "kETag";
    pcVar4 = (char *)0x5;
    break;
  case 5:
    pcVar3 = "kIfNonMatch";
    pcVar4 = (char *)0xb;
    break;
  case 6:
    pcVar3 = "kObserve";
    break;
  case 7:
    pcVar3 = "kUriPort";
    break;
  case 8:
    pcVar3 = "kLocationPath";
    pcVar4 = (char *)0xd;
    break;
  case 0xb:
    pcVar3 = "kUriPath";
    break;
  case 0xc:
    pcVar3 = "kContentFormat";
    goto LAB_001d83d7;
  case 0xe:
    pcVar3 = "kMaxAge";
    goto LAB_001d83ef;
  case 0xf:
    pcVar3 = "kUriQuery";
    goto LAB_001d837a;
  case 0x11:
    pcVar3 = "kAccept";
LAB_001d83ef:
    pcVar4 = (char *)0x7;
    break;
  case 0x14:
    pcVar3 = "kLocationQuery";
LAB_001d83d7:
    pcVar4 = (char *)0xe;
    break;
  case 0x23:
    pcVar3 = "kProxyUri";
LAB_001d837a:
    pcVar4 = (char *)0x9;
    break;
  default:
    if (iVar1 == 0x27) {
      pcVar3 = "kProxyScheme";
      pcVar4 = (char *)0xc;
      break;
    }
    if (iVar1 == 0x3c) {
      pcVar3 = "kSize1";
      pcVar4 = (char *)0x6;
      break;
    }
  case 2:
  case 9:
  case 10:
  case 0xd:
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
    local_78._0_4_ = 1;
    local_78._8_8_ = "unknown({})";
    local_68._0_8_ = 0xb;
    local_68._8_8_ = (char *)0x100000000;
    ap_Stack_50[0] = detail::parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    pcVar4 = "unknown({})";
    local_68._16_8_ = (format_string_checker<char> *)local_78;
    do {
      pcVar3 = pcVar4 + 1;
      if (*pcVar4 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar4 + 2;
      }
      else if (*pcVar4 == '{') {
        pcVar3 = detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int>&>
                           (pcVar4,"",(format_string_checker<char> *)local_78);
      }
      pcVar4 = pcVar3;
    } while (pcVar3 != "");
    local_38._0_8_ = ZEXT28(optionType);
    in_R8 = &local_38;
    fmt.size_ = 1;
    fmt.data_ = (char *)0xb;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)in_R8;
    vformat_abi_cxx11_((string *)local_78,(v10 *)"unknown({})",fmt,args);
    pcVar4 = (char *)local_78._8_8_;
    pcVar3 = (char *)local_78._0_8_;
    if ((buffer<char> *)local_78._0_8_ != (buffer<char> *)local_68) {
      operator_delete((void *)local_78._0_8_);
    }
  }
  if ((this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.precision_ref.
      kind == none &&
      (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.width_ref.kind
      == none) {
    this_00 = (ctx->out_).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    value = this;
  }
  else {
    local_78._0_8_ =
         *(undefined8 *)
          &(this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.
           super_format_specs<char>;
    local_78._8_8_ =
         *(undefined8 *)
          &(this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.
           super_format_specs<char>.type;
    local_68._0_8_ =
         *(undefined8 *)
          &(this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.width_ref;
    local_68._8_8_ =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.width_ref.val
         .name.data_;
    local_68._16_8_ =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.width_ref.val
         .name.size_;
    ap_Stack_50[0] =
         *(parse_func *)
          &(this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.
           precision_ref;
    local_48.name.data_ =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.precision_ref
         .val.name.data_;
    local_48.name.size_ =
         (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.precision_ref
         .val.name.size_;
    value = (formatter<ot::commissioner::coap::OptionType,_char,_void> *)local_78;
    detail::
    handle_dynamic_spec<fmt::v10::detail::width_checker,fmt::v10::basic_format_context<fmt::v10::appender,char>>
              ((int *)value,
               (this->super_formatter<fmt::v10::basic_string_view<char>,_char,_void>).specs_.
               width_ref,ctx);
    ref.val.name.data_ = local_48.name.data_;
    ref._0_8_ = ap_Stack_50[0];
    ref.val.name.size_ = local_48.name.size_;
    detail::
    handle_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_context<fmt::v10::appender,char>>
              ((int *)(local_78 + 4),ref,ctx);
    this_00 = (ctx->out_).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  }
  s.size_ = (size_t)value;
  s.data_ = pcVar4;
  aVar2 = detail::write<char,fmt::v10::appender>((detail *)this_00,(appender)pcVar3,s,in_R8);
  return (iterator)aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
}

Assistant:

auto fmt::formatter<ot::commissioner::coap::OptionType>::format(ot::commissioner::coap::OptionType optionType,
                                                                format_context &ctx) -> decltype(ctx.out())
{
    using ot::commissioner::coap::OptionType;
    string_view name;
    switch (optionType)
    {
    case OptionType::kIfMatch:
        name = "kIfMatch";
        break;
    case OptionType::kUriHost:
        name = "kUriHost";
        break;
    case OptionType::kETag:
        name = "kETag";
        break;
    case OptionType::kIfNonMatch:
        name = "kIfNonMatch";
        break;
    case OptionType::kObserve:
        name = "kObserve";
        break;
    case OptionType::kUriPort:
        name = "kUriPort";
        break;
    case OptionType::kLocationPath:
        name = "kLocationPath";
        break;
    case OptionType::kUriPath:
        name = "kUriPath";
        break;
    case OptionType::kContentFormat:
        name = "kContentFormat";
        break;
    case OptionType::kMaxAge:
        name = "kMaxAge";
        break;
    case OptionType::kUriQuery:
        name = "kUriQuery";
        break;
    case OptionType::kAccept:
        name = "kAccept";
        break;
    case OptionType::kLocationQuery:
        name = "kLocationQuery";
        break;
    case OptionType::kProxyUri:
        name = "kProxyUri";
        break;
    case OptionType::kProxyScheme:
        name = "kProxyScheme";
        break;
    case OptionType::kSize1:
        name = "kSize1";
        break;
    default:
        name = fmt::format(FMT_STRING("unknown({})"), static_cast<int>(optionType));
    }
    return formatter<string_view>::format(name, ctx);
}